

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O0

Status __thiscall
leveldb::ReadBlock(leveldb *this,RandomAccessFile *file,ReadOptions *options,BlockHandle *handle,
                  BlockContents *result)

{
  ReadOptions *pRVar1;
  bool bVar2;
  uint32_t masked_crc;
  uint64_t n_00;
  char *d;
  uint64_t uVar3;
  size_t sVar4;
  Slice local_170;
  Slice local_160;
  Slice local_150;
  Slice local_140;
  Slice local_130;
  char *local_120;
  char *ubuf;
  Slice local_108;
  size_t local_f8;
  size_t ulength;
  size_t local_e8;
  Slice local_e0;
  Slice local_d0;
  Slice local_c0;
  Status local_b0;
  uint32_t local_a8;
  uint32_t local_a4;
  uint32_t actual;
  uint32_t crc;
  char *data;
  Slice local_88;
  undefined4 local_78;
  Status local_68;
  Status s;
  Slice contents;
  char *buf;
  size_t n;
  size_t sStack_38;
  BlockContents *local_30;
  BlockContents *result_local;
  BlockHandle *handle_local;
  ReadOptions *options_local;
  RandomAccessFile *file_local;
  
  local_30 = result;
  result_local = (BlockContents *)handle;
  handle_local = (BlockHandle *)options;
  options_local = (ReadOptions *)file;
  file_local = (RandomAccessFile *)this;
  Slice::Slice((Slice *)&n);
  (local_30->data).data_ = (char *)n;
  (local_30->data).size_ = sStack_38;
  local_30->cachable = false;
  local_30->heap_allocated = false;
  n_00 = BlockHandle::size((BlockHandle *)result_local);
  d = (char *)operator_new__(n_00 + 5);
  Slice::Slice((Slice *)&s);
  pRVar1 = options_local;
  uVar3 = BlockHandle::offset((BlockHandle *)result_local);
  (**(code **)(*(long *)pRVar1 + 0x10))(&local_68,pRVar1,uVar3,n_00 + 5,(Slice *)&s,d);
  bVar2 = Status::ok(&local_68);
  if (bVar2) {
    sVar4 = Slice::size((Slice *)&s);
    if (sVar4 == n_00 + 5) {
      _actual = Slice::data((Slice *)&s);
      if ((handle_local->offset_ & 1) != 0) {
        masked_crc = DecodeFixed32(_actual + n_00 + 1);
        local_a4 = crc32c::Unmask(masked_crc);
        local_a8 = crc32c::Value(_actual,n_00 + 1);
        if (local_a8 != local_a4) {
          if (d != (char *)0x0) {
            operator_delete__(d);
          }
          Slice::Slice(&local_c0,"block checksum mismatch");
          Slice::Slice(&local_d0);
          Status::Corruption(&local_b0,&local_c0,&local_d0);
          Status::operator=(&local_68,&local_b0);
          Status::~Status(&local_b0);
          Status::Status((Status *)this,&local_68);
          goto LAB_00145e31;
        }
      }
      if (_actual[n_00] == '\0') {
        if (_actual == d) {
          Slice::Slice((Slice *)&ulength,d,n_00);
          (local_30->data).data_ = (char *)ulength;
          (local_30->data).size_ = local_e8;
          local_30->heap_allocated = true;
          local_30->cachable = true;
        }
        else {
          if (d != (char *)0x0) {
            operator_delete__(d);
          }
          Slice::Slice(&local_e0,_actual,n_00);
          (local_30->data).data_ = local_e0.data_;
          (local_30->data).size_ = local_e0.size_;
          local_30->heap_allocated = false;
          local_30->cachable = false;
        }
      }
      else {
        if (_actual[n_00] != '\x01') {
          if (d != (char *)0x0) {
            operator_delete__(d);
          }
          Slice::Slice(&local_160,"bad block type");
          Slice::Slice(&local_170);
          Status::Corruption((Status *)this,&local_160,&local_170);
          goto LAB_00145e31;
        }
        local_f8 = 0;
        bVar2 = port::Snappy_GetUncompressedLength(_actual,n_00,&local_f8);
        if (!bVar2) {
          if (d != (char *)0x0) {
            operator_delete__(d);
          }
          Slice::Slice(&local_108,"corrupted compressed block contents");
          Slice::Slice((Slice *)&ubuf);
          Status::Corruption((Status *)this,&local_108,(Slice *)&ubuf);
          goto LAB_00145e31;
        }
        local_120 = (char *)operator_new__(local_f8);
        bVar2 = port::Snappy_Uncompress(_actual,n_00,local_120);
        if (!bVar2) {
          if (d != (char *)0x0) {
            operator_delete__(d);
          }
          if (local_120 != (char *)0x0) {
            operator_delete__(local_120);
          }
          Slice::Slice(&local_130,"corrupted compressed block contents");
          Slice::Slice(&local_140);
          Status::Corruption((Status *)this,&local_130,&local_140);
          goto LAB_00145e31;
        }
        if (d != (char *)0x0) {
          operator_delete__(d);
        }
        Slice::Slice(&local_150,local_120,local_f8);
        (local_30->data).data_ = local_150.data_;
        (local_30->data).size_ = local_150.size_;
        local_30->heap_allocated = true;
        local_30->cachable = true;
      }
      Status::OK();
    }
    else {
      if (d != (char *)0x0) {
        operator_delete__(d);
      }
      Slice::Slice(&local_88,"truncated block read");
      Slice::Slice((Slice *)&data);
      Status::Corruption((Status *)this,&local_88,(Slice *)&data);
    }
  }
  else {
    if (d != (char *)0x0) {
      operator_delete__(d);
    }
    Status::Status((Status *)this,&local_68);
  }
LAB_00145e31:
  local_78 = 1;
  Status::~Status(&local_68);
  return (Status)(char *)this;
}

Assistant:

Status ReadBlock(RandomAccessFile* file, const ReadOptions& options,
                 const BlockHandle& handle, BlockContents* result) {
  result->data = Slice();
  result->cachable = false;
  result->heap_allocated = false;

  // Read the block contents as well as the type/crc footer.
  // See table_builder.cc for the code that built this structure.
  size_t n = static_cast<size_t>(handle.size());
  char* buf = new char[n + kBlockTrailerSize];
  Slice contents;
  Status s = file->Read(handle.offset(), n + kBlockTrailerSize, &contents, buf);
  if (!s.ok()) {
    delete[] buf;
    return s;
  }
  if (contents.size() != n + kBlockTrailerSize) {
    delete[] buf;
    return Status::Corruption("truncated block read");
  }

  // Check the crc of the type and the block contents
  const char* data = contents.data();  // Pointer to where Read put the data
  if (options.verify_checksums) {
    const uint32_t crc = crc32c::Unmask(DecodeFixed32(data + n + 1));
    const uint32_t actual = crc32c::Value(data, n + 1);
    if (actual != crc) {
      delete[] buf;
      s = Status::Corruption("block checksum mismatch");
      return s;
    }
  }

  switch (data[n]) {
    case kNoCompression:
      if (data != buf) {
        // File implementation gave us pointer to some other data.
        // Use it directly under the assumption that it will be live
        // while the file is open.
        delete[] buf;
        result->data = Slice(data, n);
        result->heap_allocated = false;
        result->cachable = false;  // Do not double-cache
      } else {
        result->data = Slice(buf, n);
        result->heap_allocated = true;
        result->cachable = true;
      }

      // Ok
      break;
    case kSnappyCompression: {
      size_t ulength = 0;
      if (!port::Snappy_GetUncompressedLength(data, n, &ulength)) {
        delete[] buf;
        return Status::Corruption("corrupted compressed block contents");
      }
      char* ubuf = new char[ulength];
      if (!port::Snappy_Uncompress(data, n, ubuf)) {
        delete[] buf;
        delete[] ubuf;
        return Status::Corruption("corrupted compressed block contents");
      }
      delete[] buf;
      result->data = Slice(ubuf, ulength);
      result->heap_allocated = true;
      result->cachable = true;
      break;
    }
    default:
      delete[] buf;
      return Status::Corruption("bad block type");
  }

  return Status::OK();
}